

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void ReplaceObsoleteElements(TidyDocImpl *doc,Node *node)

{
  Node **ppNVar1;
  Node *pNVar2;
  TidyTagId TVar3;
  
  do {
    if (node == (Node *)0x0) {
      return;
    }
    pNVar2 = node->next;
    if (node->tag != (Dict *)0x0) {
      TVar3 = node->tag->id;
      if (TVar3 == TidyTag_DIR) {
        prvTidyCoerceNode(doc,node,TidyTag_UL,yes,yes);
        if (node->tag == (Dict *)0x0) goto LAB_0013e8c9;
        TVar3 = node->tag->id;
      }
      if ((TVar3 - TidyTag_LISTING < 0x3b) &&
         ((0x400000000100001U >> ((ulong)(TVar3 - TidyTag_LISTING) & 0x3f) & 1) != 0)) {
        prvTidyCoerceNode(doc,node,TidyTag_PRE,yes,yes);
      }
    }
LAB_0013e8c9:
    ppNVar1 = &node->content;
    node = pNVar2;
    if (*ppNVar1 != (Node *)0x0) {
      ReplaceObsoleteElements(doc,*ppNVar1);
    }
  } while( true );
}

Assistant:

static void ReplaceObsoleteElements(TidyDocImpl* doc, Node* node)
{
    Node *next;

    while (node)
    {
        next = node->next;

        /* if (nodeIsDIR(node) || nodeIsMENU(node)) */
        /* HTML5 - <menu ... > is no longer obsolete */
        if (nodeIsDIR(node))
            TY_(CoerceNode)(doc, node, TidyTag_UL, yes, yes);

        if (nodeIsXMP(node) || nodeIsLISTING(node) ||
            (node->tag && node->tag->id == TidyTag_PLAINTEXT))
            TY_(CoerceNode)(doc, node, TidyTag_PRE, yes, yes);

        if (node->content)
            ReplaceObsoleteElements(doc, node->content);

        node = next;
    }
}